

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlChar * xmlGetActualEncoding(xmlParserCtxtPtr ctxt)

{
  xmlChar *local_18;
  xmlChar *encoding;
  xmlParserCtxtPtr ctxt_local;
  
  local_18 = (xmlChar *)0x0;
  if (((ctxt->input->flags & 0x10U) == 0) && ((ctxt->input->flags & 0xeU) == 0)) {
    if ((ctxt->input->buf == (xmlParserInputBufferPtr)0x0) ||
       (ctxt->input->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
      if ((ctxt->input->flags & 1U) != 0) {
        local_18 = "UTF-8";
      }
    }
    else {
      local_18 = (xmlChar *)ctxt->input->buf->encoder->name;
    }
  }
  else {
    local_18 = ctxt->encoding;
  }
  return local_18;
}

Assistant:

const xmlChar *
xmlGetActualEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *encoding = NULL;

    if ((ctxt->input->flags & XML_INPUT_USES_ENC_DECL) ||
        (ctxt->input->flags & XML_INPUT_AUTO_ENCODING)) {
        /* Preserve encoding exactly */
        encoding = ctxt->encoding;
    } else if ((ctxt->input->buf) && (ctxt->input->buf->encoder)) {
        encoding = BAD_CAST ctxt->input->buf->encoder->name;
    } else if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        encoding = BAD_CAST "UTF-8";
    }

    return(encoding);
}